

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall
SubcommandProgram_CaseCheck_Test::~SubcommandProgram_CaseCheck_Test
          (SubcommandProgram_CaseCheck_Test *this)

{
  SubcommandProgram::~SubcommandProgram(&this->super_SubcommandProgram);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(SubcommandProgram, CaseCheck) {
    args = {"Start"};
    EXPECT_THROW(run(), CLI::ExtrasError);

    app.reset();
    args = {"start"};
    run();

    app.reset();
    start->ignore_case();
    run();

    app.reset();
    args = {"Start"};
    run();
}